

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_parameters.cpp
# Opt level: O1

vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::CameraParameters::generateCameraRays
          (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           *__return_storage_ptr__,CameraParameters *this,size_t dimX,size_t dimY,ImageOrigin origin
          )

{
  pointer pvVar1;
  long lVar2;
  size_t sVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar8;
  undefined1 auVar7 [64];
  undefined1 auVar9 [56];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 in_XMM4 [16];
  vec3 vVar13;
  vec<3,_float,_(glm::qualifier)0> vVar14;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  mat4x4 viewMat;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  size_t local_120;
  long local_118;
  undefined4 local_110;
  undefined4 local_10c;
  float local_108;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_104;
  size_t local_100;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_f8;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_f4;
  undefined8 uStack_f0;
  long local_e0;
  vec<4,_float,_(glm::qualifier)0> local_d8;
  undefined1 local_c8 [16];
  mat<4,_4,_float,_(glm::qualifier)0> local_b8;
  mat<4,_4,_float,_(glm::qualifier)0> local_78;
  
  local_78.value[0].field_0 = (this->extrinsics).E.value[0].field_0;
  local_78.value[0].field_1 = (this->extrinsics).E.value[0].field_1;
  local_78.value[0].field_2 = (this->extrinsics).E.value[0].field_2;
  local_78.value[0].field_3 = (this->extrinsics).E.value[0].field_3;
  local_78.value[1].field_0 = (this->extrinsics).E.value[1].field_0;
  local_78.value[1].field_1 = (this->extrinsics).E.value[1].field_1;
  local_78.value[1].field_2 = (this->extrinsics).E.value[1].field_2;
  local_78.value[1].field_3 = (this->extrinsics).E.value[1].field_3;
  local_78.value[2].field_0 = (this->extrinsics).E.value[2].field_0;
  local_78.value[2].field_1 = (this->extrinsics).E.value[2].field_1;
  local_78.value[2].field_2 = (this->extrinsics).E.value[2].field_2;
  local_78.value[2].field_3 = (this->extrinsics).E.value[2].field_3;
  local_78.value[3].field_0 = (this->extrinsics).E.value[3].field_0;
  local_78.value[3].field_1 = (this->extrinsics).E.value[3].field_1;
  local_78.value[3].field_2 = (this->extrinsics).E.value[3].field_2;
  local_78.value[3].field_3 = (this->extrinsics).E.value[3].field_3;
  local_f8 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
             (this->intrinsics).aspectRatioWidthOverHeight;
  fVar4 = tanf((this->intrinsics).fovVerticalDegrees * 0.017453292 * 0.5);
  local_b8.value[0].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  local_b8.value[0].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  local_b8.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
  local_b8.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  local_b8.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_b8.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_b8.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_b8.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  local_b8.value[0].field_1.y = 0.0;
  local_b8.value[0].field_0.x = 2.0 / (fVar4 * local_f8.x + fVar4 * local_f8.x);
  local_b8.value[1]._0_8_ = (ulong)(uint)(2.0 / (fVar4 + fVar4)) << 0x20;
  auVar5._8_4_ = 0xbf800000;
  auVar5._0_8_ = 0xbf800000bf800000;
  auVar5._12_4_ = 0xbf800000;
  local_b8.value[2]._8_8_ = vmovlps_avx(auVar5);
  local_b8.value[3].field_2 =
       (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0xc0000000;
  local_b8.value[3].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0;
  local_d8.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
  local_d8.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
  auVar5 = vcvtusi2ss_avx512f(in_XMM4,dimX);
  local_d8.field_2 = auVar5._0_4_;
  auVar5 = vcvtusi2ss_avx512f(in_XMM4,dimY);
  local_d8.field_3 = auVar5._0_4_;
  uVar8 = auVar5._8_8_;
  vVar13 = CameraExtrinsics::getPosition(&this->extrinsics);
  local_104 = vVar13.field_2;
  local_f8 = vVar13.field_0;
  aStack_f4 = vVar13.field_1;
  uStack_f0 = uVar8;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(__return_storage_ptr__,dimY * dimX,(allocator_type *)&local_12c);
  if (dimY != 0) {
    local_e0 = dimX * 0xc;
    local_118 = 8;
    local_120 = 0;
    local_100 = dimY;
    do {
      if (dimX != 0) {
        auVar5 = vcvtusi2ss_avx512f(in_XMM4,local_120);
        local_10c = auVar5._0_4_;
        auVar5 = vcvtusi2ss_avx512f(in_XMM4,local_100 - local_120);
        auVar7 = ZEXT1664(auVar5);
        local_110 = auVar5._0_4_;
        sVar3 = 0;
        lVar2 = local_118;
        do {
          auVar9 = auVar7._8_56_;
          if (origin == LowerLeft) {
            auVar5 = vcvtusi2ss_avx512f(in_XMM4,sVar3);
            local_12c = auVar5._0_4_;
            local_128 = local_10c;
LAB_00233c7b:
            auVar9 = (undefined1  [56])0x0;
            local_124 = 0;
          }
          else if (origin == UpperLeft) {
            auVar5 = vcvtusi2ss_avx512f(in_XMM4,sVar3);
            local_12c = auVar5._0_4_;
            local_128 = local_110;
            goto LAB_00233c7b;
          }
          vVar14 = glm::unProjectNO<float,float,(glm::qualifier)0>
                             ((vec<3,_float,_(glm::qualifier)0> *)&local_12c,&local_78,&local_b8,
                              &local_d8);
          auVar7._0_8_ = vVar14._0_8_;
          auVar7._8_56_ = auVar9;
          fVar11 = vVar14.field_2.z - local_104.z;
          auVar12._4_4_ = aStack_f4;
          auVar12._0_4_ = local_f8;
          auVar12._8_8_ = uStack_f0;
          auVar12 = vsubps_avx(auVar7._0_16_,auVar12);
          auVar6._0_4_ = auVar12._0_4_ * auVar12._0_4_;
          auVar6._4_4_ = auVar12._4_4_ * auVar12._4_4_;
          auVar6._8_4_ = auVar12._8_4_ * auVar12._8_4_;
          auVar6._12_4_ = auVar12._12_4_ * auVar12._12_4_;
          auVar5 = vhaddps_avx(auVar6,auVar6);
          fVar4 = fVar11 * fVar11 + auVar5._0_4_;
          if (fVar4 < 0.0) {
            local_108 = fVar11;
            local_c8 = auVar12;
            fVar4 = sqrtf(fVar4);
            fVar11 = local_108;
            auVar12 = local_c8;
          }
          else {
            auVar5 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
            fVar4 = auVar5._0_4_;
          }
          fVar4 = 1.0 / fVar4;
          auVar10._0_4_ = auVar12._0_4_ * fVar4;
          auVar10._4_4_ = auVar12._4_4_ * fVar4;
          auVar10._8_4_ = auVar12._8_4_ * fVar4;
          auVar10._12_4_ = auVar12._12_4_ * fVar4;
          auVar7 = ZEXT464((uint)(fVar11 * fVar4));
          pvVar1 = (__return_storage_ptr__->
                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar8 = vmovlps_avx(auVar10);
          *(undefined8 *)((long)pvVar1 + lVar2 + -8) = uVar8;
          *(float *)((long)&pvVar1->field_0 + lVar2) = fVar11 * fVar4;
          sVar3 = sVar3 + 1;
          lVar2 = lVar2 + 0xc;
        } while (dimX != sVar3);
      }
      local_120 = local_120 + 1;
      local_118 = local_118 + local_e0;
    } while (local_120 != local_100);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<glm::vec3> CameraParameters::generateCameraRays(size_t dimX, size_t dimY, ImageOrigin origin) const {

  // TODO this has not been tested for the case where dimX/dimY do not match the aspectRatio for the cameraParams

  // prep values
  glm::mat4x4 viewMat = getViewMat();
  glm::mat4 projMat =
      glm::infinitePerspective(glm::radians(getFoVVerticalDegrees()), getAspectRatioWidthOverHeight(), 1.f);
  glm::vec4 viewport = {0., 0., dimX, dimY};
  glm::vec3 rootPos = getPosition();
  size_t nPix = dimX * dimY;

  // allocate output
  std::vector<glm::vec3> result(dimX * dimY);

  // populate the rays
  for (size_t iY = 0; iY < dimY; iY++) {
    for (size_t iX = 0; iX < dimX; iX++) {

      // populate the rays
      // (this arithmetic could certainly be optimized)

      glm::vec3 screenPos3;
      switch (origin) {
      case ImageOrigin::UpperLeft:
        screenPos3 = glm::vec3{iX, dimY - iY, 0.};
        break;
      case ImageOrigin::LowerLeft:
        screenPos3 = glm::vec3{iX, iY, 0.};
        break;
      }

      glm::vec3 worldPos = glm::unProject(screenPos3, viewMat, projMat, viewport);
      glm::vec3 worldRayDir = glm::normalize(worldPos - rootPos);

      size_t ind = iY * dimX + iX;
      result[ind] = worldRayDir;
    }
  }

  return result;
}